

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

bool peparse::readDword(bounded_buffer *b,uint32_t offset,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  string local_28;
  
  if (b == (bounded_buffer *)0x0) {
    err = 10;
    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
    to_string<unsigned_int>(&local_28,0x80,f);
    std::operator+(&bStack_48,":",&local_28);
    std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
  }
  else {
    if ((ulong)offset + 3 < (ulong)b->bufLen) {
      uVar1 = *(uint *)(b->buf + offset);
      uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      if (b->swapBytes == false) {
        uVar2 = uVar1;
      }
      *out = uVar2;
      return true;
    }
    err = 0xb;
    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
    to_string<unsigned_int>(&local_28,0x85,f_00);
    std::operator+(&bStack_48,":",&local_28);
    std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&bStack_48);
  std::__cxx11::string::~string((string *)&local_28);
  return false;
}

Assistant:

bool readDword(bounded_buffer *b, std::uint32_t offset, std::uint32_t &out) {
  if (b == nullptr) {
    PE_ERR(PEERR_BUFFER);
    return false;
  }

  if (static_cast<std::uint64_t>(offset) + 3 >= b->bufLen) {
    PE_ERR(PEERR_ADDRESS);
    return false;
  }

  std::uint32_t tmp;
  memcpy(&tmp, (b->buf + offset), sizeof(std::uint32_t));
  if (b->swapBytes) {
    out = byteSwapUint32(tmp);
  } else {
    out = tmp;
  }

  return true;
}